

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O3

void __thiscall GlobOpt::RecordInlineeFrameInfo(GlobOpt *this,Instr *inlineeEnd)

{
  OpCode OVar1;
  InlineeFrameInfo *pIVar2;
  Opnd *pOVar3;
  _func_int **pp_Var4;
  List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pIVar5;
  code *pcVar6;
  bool bVar7;
  OpndKind OVar8;
  BOOLEAN BVar9;
  ArgSlot AVar10;
  uint uVar11;
  uint uVar12;
  uint functionId;
  Func *curFunc;
  undefined4 *puVar13;
  StackSym *pSVar14;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  Value *pVVar15;
  GlobOptBlockData *this_03;
  Value *pVVar16;
  Func *pFVar17;
  uint uVar18;
  InlineeFrameInfoValueType IVar19;
  Instr *pIVar20;
  Instr *pIVar21;
  BailoutConstantValue BVar22;
  anon_union_8_3_5e50e90d_for_u local_58;
  StackSym *local_40;
  
  if (this->prePassLoop == (Loop *)0x0) {
    pIVar2 = inlineeEnd->m_func->frameInfo;
    if (pIVar2->isRecorded != true) {
      pSVar14 = IR::Opnd::GetStackSym(inlineeEnd->m_src2);
      pIVar20 = (pSVar14->field_5).m_instrDef;
      if ((pIVar20 != (Instr *)0x0 & pSVar14->field_0x18) == 1) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar7) goto LAB_0048aacc;
        *puVar13 = 0;
        pIVar20 = (pSVar14->field_5).m_instrDef;
      }
      do {
        if ((pIVar20->m_src2 == (Opnd *)0x0) ||
           (OVar8 = IR::Opnd::GetKind(pIVar20->m_src2), OVar8 != OpndKindSym)) {
LAB_0048a4b4:
          pIVar21 = (Instr *)0x0;
        }
        else {
          pOVar3 = pIVar20->m_src2;
          OVar8 = IR::Opnd::GetKind(pOVar3);
          if (OVar8 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar7) goto LAB_0048aacc;
            *puVar13 = 0;
          }
          pp_Var4 = pOVar3[1]._vptr_Opnd;
          if (*(char *)((long)pp_Var4 + 0x14) != '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar7) goto LAB_0048aacc;
            *puVar13 = 0;
          }
          uVar11 = *(uint *)(pp_Var4 + 3);
          uVar18 = uVar11 & 0x100000;
          if ((uVar18 != 0) && (*(short *)((long)pp_Var4 + 0x16) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
            if (!bVar7) goto LAB_0048aacc;
            *puVar13 = 0;
            uVar11 = *(uint *)(pp_Var4 + 3);
            uVar18 = uVar11 & 0x100000;
          }
          if (uVar18 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
            if (!bVar7) goto LAB_0048aacc;
            *puVar13 = 0;
            uVar11 = *(uint *)(pp_Var4 + 3);
          }
          if (((((uVar11 & 1) == 0) || (pp_Var4[5] == (_func_int *)0x0)) &&
              (bVar7 = Func::IsInPhase(inlineeEnd->m_func,FGPeepsPhase), !bVar7)) &&
             (bVar7 = Func::IsInPhase(inlineeEnd->m_func,FGBuildPhase), !bVar7)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar7) goto LAB_0048aacc;
            *puVar13 = 0;
          }
          if (((ulong)pp_Var4[3] & 1) == 0) goto LAB_0048a4b4;
          pIVar21 = (Instr *)pp_Var4[5];
        }
        OVar1 = pIVar20->m_opcode;
        if (OVar1 != ArgOut_A_InlineSpecialized) {
          if (OVar1 == InlineeStart) {
            if ((pIVar2->function).type != InlineeFrameInfoValueType_None) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                 ,0x32a,
                                 "(frameInfo->function.type == InlineeFrameInfoValueType_None)",
                                 "frameInfo->function.type == InlineeFrameInfoValueType_None");
              if (!bVar7) goto LAB_0048aacc;
              *puVar13 = 0;
            }
            pOVar3 = pIVar20->m_src1;
            OVar8 = IR::Opnd::GetKind(pOVar3);
            if (OVar8 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar7) goto LAB_0048aacc;
              *puVar13 = 0;
            }
            bVar7 = StackSym::IsConst((StackSym *)pOVar3[1]._vptr_Opnd);
            if (bVar7) {
              BVar22 = StackSym::GetConstValueForBailout((StackSym *)pOVar3[1]._vptr_Opnd);
              (pIVar2->function).type = InlineeFrameInfoValueType_Const;
              (pIVar2->function).field_1.constValue.type = BVar22.type;
              (pIVar2->function).field_1.constValue.u = BVar22.u;
            }
            else {
              pVVar15 = pIVar2->functionSymStartValue;
              if (pVVar15 == (Value *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                   ,0x334,"(frameInfo->functionSymStartValue != nullptr)",
                                   "frameInfo->functionSymStartValue != nullptr");
                if (!bVar7) goto LAB_0048aacc;
                *puVar13 = 0;
                pVVar15 = pIVar2->functionSymStartValue;
              }
              this_03 = CurrentBlockData(this);
              pVVar16 = GlobOptBlockData::FindValue(this_03,(Sym *)pOVar3[1]._vptr_Opnd);
              if (pVVar15->valueNumber != pVVar16->valueNumber) {
                pFVar17 = pIVar20->m_func;
                do {
                  *(uint *)&pFVar17->field_0x240 = *(uint *)&pFVar17->field_0x240 & 0xfffff7fd;
                  pFVar17->frameInfo = (InlineeFrameInfo *)0x0;
                  pFVar17 = pFVar17->parentFunc;
                } while (pFVar17 != (Func *)0x0);
LAB_0048aa01:
                Memory::
                DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                          (this->alloc,pIVar2->intSyms);
                pIVar2->intSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
                Memory::
                DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                          (this->alloc,pIVar2->floatSyms);
                pIVar2->floatSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
                Memory::
                DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                          (this->alloc,pIVar2->varSyms);
                pIVar2->varSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
                pIVar2->isRecorded = true;
                return;
              }
              pSVar14 = (StackSym *)pOVar3[1]._vptr_Opnd;
              (pIVar2->function).type = InlineeFrameInfoValueType_Sym;
              (pIVar2->function).field_1.sym = pSVar14;
            }
          }
          else {
            if (OVar1 == StartCall) {
              if (pIVar21 != (Instr *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                   ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
                if (!bVar7) goto LAB_0048aacc;
                *puVar13 = 0;
              }
              goto LAB_0048aa01;
            }
            if ((this->field_0xf7 & 2) != 0) goto LAB_0048a9f8;
            pOVar3 = pIVar20->m_dst;
            OVar8 = IR::Opnd::GetKind(pOVar3);
            if (OVar8 != OpndKindSym) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
              if (!bVar7) goto LAB_0048aacc;
              *puVar13 = 0;
            }
            pSVar14 = (StackSym *)pOVar3[1]._vptr_Opnd;
            if ((pSVar14->super_Sym).m_kind != SymKindStack) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                 ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
              if (!bVar7) goto LAB_0048aacc;
              *puVar13 = 0;
            }
            AVar10 = StackSym::GetArgSlotNum(pSVar14);
            pOVar3 = pIVar20->m_src1;
            local_40 = IR::Opnd::GetStackSym(pOVar3);
            if (local_40 == (StackSym *)0x0) {
              BVar22 = IR::Opnd::GetConstValue(pOVar3);
LAB_0048a94a:
              local_58 = BVar22.u;
              local_40 = (StackSym *)(ulong)BVar22.type;
              IVar19 = InlineeFrameInfoValueType_Const;
            }
            else {
              bVar7 = StackSym::IsConst(local_40);
              if ((bVar7) && (bVar7 = StackSym::IsInt64Const(local_40), !bVar7)) {
LAB_0048a945:
                BVar22 = StackSym::GetConstValueForBailout(local_40);
                goto LAB_0048a94a;
              }
              this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar12 = JITTimeFunctionBody::GetSourceContextId(this_01);
              this_02 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
              bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,CopyPropPhase,uVar12,functionId)
              ;
              if ((((!bVar7) &&
                   ((pVVar15 = GlobOptBlockData::FindValue
                                         (&this->currentBlock->globOptData,&local_40->super_Sym),
                    pVVar15 != (Value *)0x0 &&
                    (pSVar14 = GlobOptBlockData::GetCopyPropSym
                                         (&this->currentBlock->globOptData,&local_40->super_Sym,
                                          pVVar15), pSVar14 != (StackSym *)0x0)))) &&
                  (pIVar2->varSyms->head != (Type_conflict)0x0)) &&
                 (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pIVar2->varSyms,(pSVar14->super_Sym).m_id), BVar9 != '\0')) {
                local_40 = pSVar14;
              }
              if ((pIVar2->intSyms->head == (Type_conflict)0x0) ||
                 (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pIVar2->intSyms,(local_40->super_Sym).m_id), BVar9 == '\0')) {
                if ((pIVar2->floatSyms->head == (Type_conflict)0x0) ||
                   (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                                      (pIVar2->floatSyms,(local_40->super_Sym).m_id), BVar9 == '\0')
                   ) {
                  BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pIVar2->varSyms,(local_40->super_Sym).m_id);
                  if (BVar9 == '\0') {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar13 = 1;
                    bVar7 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                       ,0x36b,"(frameInfo->varSyms->Test(argSym->m_id))",
                                       "frameInfo->varSyms->Test(argSym->m_id)");
                    if (bVar7) goto LAB_0048a915;
                    goto LAB_0048aacc;
                  }
                }
                else {
                  local_40 = StackSym::GetFloat64EquivSym(local_40,(Func *)0x0);
                  if (local_40 == (StackSym *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar13 = 1;
                    uVar12 = 0x367;
                    goto LAB_0048a8f3;
                  }
                }
              }
              else {
                local_40 = StackSym::GetInt32EquivSym(local_40,(Func *)0x0);
                if (local_40 == (StackSym *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  uVar12 = 0x361;
LAB_0048a8f3:
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                     ,uVar12,"(argSym)","argSym");
                  if (!bVar7) goto LAB_0048aacc;
                  local_40 = (StackSym *)0x0;
LAB_0048a915:
                  *puVar13 = 0;
                }
              }
              bVar7 = StackSym::IsConst(local_40);
              IVar19 = InlineeFrameInfoValueType_Sym;
              if ((bVar7) && (bVar7 = StackSym::IsInt64Const(local_40), !bVar7)) goto LAB_0048a945;
            }
            if (AVar10 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                 ,0x377,"(argSlot >= 1)","argSlot >= 1");
              if (!bVar7) goto LAB_0048aacc;
              *puVar13 = 0;
            }
            this_00 = pIVar2->arguments;
            JsUtil::
            List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_00,(uint)AVar10);
            pIVar5 = (this_00->
                     super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).buffer;
            pIVar5[(ulong)AVar10 - 1].type = IVar19;
            *(StackSym **)&pIVar5[(ulong)AVar10 - 1].field_1 = local_40;
            pIVar5[(ulong)AVar10 - 1].field_1.constValue.u = local_58;
            uVar11 = (this_00->
                     super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).count;
            uVar18 = (uint)AVar10;
            if ((int)(uint)AVar10 < (int)uVar11) {
              uVar18 = uVar11;
            }
            (this_00->
            super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
            count = uVar18;
          }
        }
LAB_0048a9f8:
        pIVar20 = pIVar21;
        if (pIVar21 == (Instr *)0x0) goto LAB_0048aa01;
      } while( true );
    }
    if ((pIVar2->function).type == InlineeFrameInfoValueType_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x322,"(frameInfo->function.type != InlineeFrameInfoValueType_None)",
                         "frameInfo->function.type != InlineeFrameInfoValueType_None");
      if (!bVar7) {
LAB_0048aacc:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar13 = 0;
    }
  }
  return;
}

Assistant:

void GlobOpt::RecordInlineeFrameInfo(IR::Instr* inlineeEnd)
{
    if (this->IsLoopPrePass())
    {
        return;
    }
    InlineeFrameInfo* frameInfo = inlineeEnd->m_func->frameInfo;
    if (frameInfo->isRecorded)
    {
        Assert(frameInfo->function.type != InlineeFrameInfoValueType_None);
        // Due to Cmp peeps in flow graph - InlineeEnd can be cloned.
        return;
    }
    inlineeEnd->IterateArgInstrs([=] (IR::Instr* argInstr)
    {
        if (argInstr->m_opcode == Js::OpCode::InlineeStart)
        {
            Assert(frameInfo->function.type == InlineeFrameInfoValueType_None);
            IR::RegOpnd* functionObject = argInstr->GetSrc1()->AsRegOpnd();
            if (functionObject->m_sym->IsConst())
            {
                frameInfo->function = InlineFrameInfoValue(functionObject->m_sym->GetConstValueForBailout());
            }
            else
            {
                // If the value of the functionObject symbol has changed between the inlineeStart and the inlineeEnd,
                // we don't record the inlinee frame info (see OS#18318884).
                Assert(frameInfo->functionSymStartValue != nullptr);
                if (!frameInfo->functionSymStartValue->IsEqualTo(CurrentBlockData()->FindValue(functionObject->m_sym)))
                {
                    argInstr->m_func->DisableCanDoInlineArgOpt();
                    return true;
                }

                frameInfo->function = InlineFrameInfoValue(functionObject->m_sym);
            }
        }
        else if(!GetIsAsmJSFunc()) // don't care about saving arg syms for wasm/asm.js
        {
            Js::ArgSlot argSlot = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
            IR::Opnd* argOpnd = argInstr->GetSrc1();
            InlineFrameInfoValue frameInfoValue;
            StackSym* argSym = argOpnd->GetStackSym();
            if (!argSym)
            {
                frameInfoValue = InlineFrameInfoValue(argOpnd->GetConstValue());
            }
            else if (argSym->IsConst() && !argSym->IsInt64Const())
            {
                // InlineFrameInfo doesn't currently support Int64Const
                frameInfoValue = InlineFrameInfoValue(argSym->GetConstValueForBailout());
            }
            else
            {
                if (!PHASE_OFF(Js::CopyPropPhase, func))
                {
                    Value* value = this->currentBlock->globOptData.FindValue(argSym);
                    if (value)
                    {
                        StackSym * copyPropSym = this->currentBlock->globOptData.GetCopyPropSym(argSym, value);
                        if (copyPropSym &&
                            frameInfo->varSyms->TestEmpty() && frameInfo->varSyms->Test(copyPropSym->m_id))
                        {
                            argSym = copyPropSym;
                        }
                    }
                }

                if (frameInfo->intSyms->TestEmpty() && frameInfo->intSyms->Test(argSym->m_id))
                {
                    // Var version of the sym is not live, use the int32 version
                    argSym = argSym->GetInt32EquivSym(nullptr);
                    Assert(argSym);
                }
                else if (frameInfo->floatSyms->TestEmpty() && frameInfo->floatSyms->Test(argSym->m_id))
                {
                    // Var/int32 version of the sym is not live, use the float64 version
                    argSym = argSym->GetFloat64EquivSym(nullptr);
                    Assert(argSym);
                }
                else
                {
                    Assert(frameInfo->varSyms->Test(argSym->m_id));
                }

                if (argSym->IsConst() && !argSym->IsInt64Const())
                {
                    frameInfoValue = InlineFrameInfoValue(argSym->GetConstValueForBailout());
                }
                else
                {
                    frameInfoValue = InlineFrameInfoValue(argSym);
                }
            }
            Assert(argSlot >= 1);
            frameInfo->arguments->SetItem(argSlot - 1, frameInfoValue);
        }
        return false;
    });

    JitAdelete(this->alloc, frameInfo->intSyms);
    frameInfo->intSyms = nullptr;
    JitAdelete(this->alloc, frameInfo->floatSyms);
    frameInfo->floatSyms = nullptr;
    JitAdelete(this->alloc, frameInfo->varSyms);
    frameInfo->varSyms = nullptr;
    frameInfo->isRecorded = true;
}